

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O1

bool __thiscall Arbitrarylist::Run(Arbitrarylist *this)

{
  _List_node_base *p_Var1;
  bool bVar2;
  vector<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  vv;
  list<int,_std::allocator<int>_> v;
  size_t in_stack_ffffffffffffffa8;
  vector<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  local_50;
  _List_node_base local_38;
  long local_28;
  
  testinator::Arbitrary<std::__cxx11::list<int,_std::allocator<int>_>_>::generate
            (in_stack_ffffffffffffffa8,0x140cb0);
  testinator::Arbitrary<std::__cxx11::list<int,_std::allocator<int>_>_>::shrink
            (&local_50,(output_type *)&local_38);
  if ((long)local_50.
            super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_50.
            super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x30) {
    bVar2 = local_50.
            super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].super__List_base<int,_std::allocator<int>_>
            ._M_impl._M_node._M_size +
            ((local_50.
              super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__List_base<int,_std::allocator<int>_>)._M_impl._M_node._M_size == local_28;
  }
  else {
    bVar2 = false;
  }
  std::
  vector<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ::~vector(&local_50);
  while (local_38._M_next != &local_38) {
    p_Var1 = (((_List_base<int,_std::allocator<int>_> *)&(local_38._M_next)->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(local_38._M_next,0x18);
    local_38._M_next = p_Var1;
  }
  return bVar2;
}

Assistant:

DEF_TEST(list, Arbitrary)
{
  testinator::Arbitrary<list<int>> a;
  list<int> v = a.generate(1,0);
  vector<list<int>> vv = a.shrink(v);
  return vv.size() == 2
    && vv[0].size() + vv[1].size() == v.size();
}